

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.hpp
# Opt level: O0

void __thiscall
gzip::Compressor::compress<std::__cxx11::string>
          (Compressor *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output,char *data,
          size_t size)

{
  int iVar1;
  runtime_error *prVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  size_t increase;
  size_t size_compressed;
  int mem_level;
  int window_bits;
  z_stream deflate_s;
  size_t size_local;
  char *data_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output_local;
  Compressor *this_local;
  
  if (this->max_ < size) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"size may use more memory than intended when decompressing");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  deflate_s.state = (internal_state *)0x0;
  deflate_s.zalloc = (alloc_func)0x0;
  deflate_s.zfree = (free_func)0x0;
  deflate_s.next_in._0_4_ = 0;
  _mem_level = (char *)0x0;
  iVar1 = deflateInit2_(&mem_level,this->level_,8,0x1f,8,0,"1.2.11",0x70);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"deflate init failed");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  deflate_s.next_in._0_4_ = (undefined4)size;
  increase = 0;
  _mem_level = data;
  do {
    lVar3 = (size >> 1) + 0x400;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 < increase + lVar3) {
      std::__cxx11::string::resize((ulong)output);
    }
    deflate_s.next_out._0_4_ = (uint)lVar3;
    lVar5 = std::__cxx11::string::operator[]((ulong)output);
    deflate_s.total_in = lVar5 + increase;
    deflate(&mem_level,4);
    increase = (lVar3 - (ulong)(uint)deflate_s.next_out) + increase;
  } while ((uint)deflate_s.next_out == 0);
  deflateEnd(&mem_level);
  std::__cxx11::string::resize((ulong)output);
  return;
}

Assistant:

void compress(InputType &output,
                      const char *data,
                      std::size_t size) const {

#ifdef DEBUG
            // Verify if size input will fit into unsigned int, type used for zlib's avail_in
            if (size > std::numeric_limits<unsigned int>::max())
            {
                throw std::runtime_error("size arg is too large to fit into unsigned int type");
            }
#endif
            if (size > max_) {
                throw std::runtime_error("size may use more memory than intended when decompressing");
            }

            z_stream deflate_s;
            deflate_s.zalloc = Z_NULL;
            deflate_s.zfree = Z_NULL;
            deflate_s.opaque = Z_NULL;
            deflate_s.avail_in = 0;
            deflate_s.next_in = Z_NULL;

            // The windowBits parameter is the base two logarithm of the window size (the size of the history buffer).
            // It should be in the range 8..15 for this version of the library.
            // Larger values of this parameter result in better compression at the expense of memory usage.
            // This range of values also changes the decoding type:
            //  -8 to -15 for raw deflate
            //  8 to 15 for zlib
            // (8 to 15) + 16 for gzip
            // (8 to 15) + 32 to automatically detect gzip/zlib header (decompression/inflate only)
            constexpr int window_bits = 15 + 16; // gzip with windowbits of 15

            constexpr int mem_level = 8;
            // The memory requirements for deflate are (in bytes):
            // (1 << (window_bits+2)) +  (1 << (mem_level+9))
            // with a default value of 8 for mem_level and our window_bits of 15
            // this is 128Kb

#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wold-style-cast"
            if (deflateInit2(&deflate_s, level_, Z_DEFLATED, window_bits, mem_level, Z_DEFAULT_STRATEGY) != Z_OK) {
                throw std::runtime_error("deflate init failed");
            }
#pragma GCC diagnostic pop

            deflate_s.next_in = reinterpret_cast<z_const Bytef *>(data);
            deflate_s.avail_in = static_cast<unsigned int>(size);

            std::size_t size_compressed = 0;
            do {
                size_t increase = size / 2 + 1024;
                if (output.size() < (size_compressed + increase)) {
                    output.resize(size_compressed + increase);
                }
                // There is no way we see that "increase" would not fit in an unsigned int,
                // hence we use static cast here to avoid -Wshorten-64-to-32 error
                deflate_s.avail_out = static_cast<unsigned int>(increase);
                deflate_s.next_out = reinterpret_cast<Bytef *>((&output[0] + size_compressed));
                // From http://www.zlib.net/zlib_how.html
                // "deflate() has a return value that can indicate errors, yet we do not check it here.
                // Why not? Well, it turns out that deflate() can do no wrong here."
                // Basically only possible error is from deflateInit not working properly
                deflate(&deflate_s, Z_FINISH);
                size_compressed += (increase - deflate_s.avail_out);
            } while (deflate_s.avail_out == 0);

            deflateEnd(&deflate_s);
            output.resize(size_compressed);
        }